

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
rapic::header::get_real_array
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,header *this)

{
  char *pcVar1;
  runtime_error *this_00;
  pointer __nptr;
  double val;
  char *end;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __nptr = (this->value_)._M_dataplus._M_p;
  do {
    while( true ) {
      if (*__nptr == '\0') {
        return __return_storage_ptr__;
      }
      val = strtod(__nptr,&end);
      pcVar1 = end;
      if (end == __nptr && val == 0.0) break;
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&val);
      __nptr = pcVar1;
    }
    for (; *__nptr == ' '; __nptr = __nptr + 1) {
    }
  } while (*__nptr == '\0');
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"bad double value");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto header::get_real_array() const -> std::vector<double>
{
  std::vector<double> ret;
  auto pos = value_.c_str();
  while (*pos != '\0')
  {
    char* end;
    auto val = strtod(pos, &end);

    // did the conversion fail?
    if (val == 0 && end == pos)
    {
      // check if it is just trailing spaces
      while (*pos == ' ')
        ++pos;
      if (*pos != '\0')
        throw std::runtime_error{"bad double value"};
    }
    else
    {
      ret.push_back(val);
      pos = end;
    }
  }
  return ret;
}